

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Battle.cpp
# Opt level: O0

void __thiscall Battle::playerTurn(Battle *this)

{
  bool local_19;
  int local_18;
  int iStack_14;
  bool turnAgain;
  int y;
  int x;
  Battle *this_local;
  
  local_19 = true;
  _y = this;
  do {
    Player::areaNavigate(this->player,&stack0xffffffffffffffec,&local_18);
    Player::attack(this->player,this->enemy,iStack_14,local_18,&local_19);
  } while ((local_19 & 1U) != 0);
  return;
}

Assistant:

void Battle::playerTurn() {
    int x,y;
    bool turnAgain = true;
    do {
        player->areaNavigate(x,y);
        player->attack(*enemy,x,y,turnAgain);
    } while (turnAgain);

}